

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkmanagerservice.cpp
# Opt level: O2

void __thiscall QNetworkManagerInterface::~QNetworkManagerInterface(QNetworkManagerInterface *this)

{
  long in_FS_OFFSET;
  QLatin1StringView latin1;
  QLatin1StringView latin1_00;
  QLatin1StringView latin1_01;
  QLatin1StringView latin1_02;
  QArrayDataPointer<char16_t> local_a0;
  QArrayDataPointer<char16_t> local_88;
  QArrayDataPointer<char16_t> local_70;
  QArrayDataPointer<char16_t> local_58;
  QDBusConnection local_40 [8];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  QDBusConnection::systemBus();
  latin1.m_data = "org.freedesktop.NetworkManager";
  latin1.m_size = 0x1e;
  QString::QString((QString *)&local_58,latin1);
  latin1_00.m_data = "/org/freedesktop/NetworkManager";
  latin1_00.m_size = 0x1f;
  QString::QString((QString *)&local_70,latin1_00);
  latin1_01.m_data = "org.freedesktop.DBus.Properties";
  latin1_01.m_size = 0x1f;
  QString::QString((QString *)&local_88,latin1_01);
  latin1_02.m_data = "PropertiesChanged";
  latin1_02.m_size = 0x11;
  QString::QString((QString *)&local_a0,latin1_02);
  QDBusConnection::disconnect
            ((QString *)local_40,(QString *)&local_58,(QString *)&local_70,(QString *)&local_88,
             (QObject *)&local_a0,(char *)this);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_a0);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_88);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_70);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
  QDBusConnection::~QDBusConnection(local_40);
  QtPrivate::
  QExplicitlySharedDataPointerV2<QMapData<std::map<QString,_QVariant,_std::less<QString>,_std::allocator<std::pair<const_QString,_QVariant>_>_>_>_>
  ::~QExplicitlySharedDataPointerV2
            ((QExplicitlySharedDataPointerV2<QMapData<std::map<QString,_QVariant,_std::less<QString>,_std::allocator<std::pair<const_QString,_QVariant>_>_>_>_>
              *)(this + 0x10));
  QDBusAbstractInterface::~QDBusAbstractInterface((QDBusAbstractInterface *)this);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QNetworkManagerInterface::~QNetworkManagerInterface()
{
    QDBusConnection::systemBus().disconnect(NM_DBUS_SERVICE, NM_DBUS_PATH,
            DBUS_PROPERTIES_INTERFACE, propertiesChangedKey, this,
            SLOT(setProperties(QString,QMap<QString,QVariant>,QList<QString>)));
}